

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

int FnNoise5_float(float *array,long nx,long ny,int nullcheck,float nullvalue,long *ngood,
                  float *minval,float *maxval,double *noise2,double *noise3,double *noise5,
                  int *status)

{
  bool bVar1;
  bool bVar2;
  int extraout_EAX;
  size_t __nmemb;
  float *arr;
  float *arr_00;
  double *arr_01;
  double *__ptr;
  double *__base;
  double *__base_00;
  size_t sVar3;
  size_t sVar4;
  float *extraout_RAX;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  size_t __nmemb_00;
  float *pfVar10;
  int n;
  long lVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  size_t local_c8;
  size_t local_70;
  
  lVar5 = 1;
  __nmemb = ny;
  if (nx < 9) {
    __nmemb = 1;
    lVar5 = ny;
  }
  __nmemb_00 = lVar5 * nx;
  if ((long)__nmemb_00 < 9) {
    if ((long)__nmemb_00 < 1) {
      fVar19 = -3.4028235e+38;
      fVar26 = 3.4028235e+38;
      arr = (float *)0x0;
    }
    else {
      fVar26 = 3.4028235e+38;
      fVar19 = -3.4028235e+38;
      lVar5 = 0;
      arr = (float *)0x0;
      do {
        if (nullcheck == 0) {
LAB_001f6da7:
          fVar12 = array[lVar5];
          fVar16 = fVar12;
          if (fVar26 <= fVar12) {
            fVar16 = fVar26;
          }
          if (fVar12 <= fVar19) {
            fVar12 = fVar19;
          }
          fVar19 = fVar12;
          arr = (float *)((long)arr + 1);
          fVar26 = fVar16;
        }
        else if ((array[lVar5] != nullvalue) || (NAN(array[lVar5]) || NAN(nullvalue)))
        goto LAB_001f6da7;
        lVar5 = lVar5 + 1;
      } while (__nmemb_00 - lVar5 != 0);
    }
    if (minval != (float *)0x0) {
      *minval = fVar26;
    }
    if (maxval != (float *)0x0) {
      *maxval = fVar19;
    }
    if (ngood != (long *)0x0) {
      *ngood = (long)arr;
    }
    if (noise2 != (double *)0x0) {
      *noise2 = 0.0;
    }
    if (noise3 != (double *)0x0) {
      *noise3 = 0.0;
    }
    if (noise5 != (double *)0x0) {
      *noise5 = 0.0;
    }
  }
  else {
    bVar1 = minval != (float *)0x0;
    bVar2 = maxval != (float *)0x0;
    arr = (float *)calloc(__nmemb_00,4);
    if (arr != (float *)0x0) {
      arr_00 = (float *)calloc(__nmemb_00,4);
      if (arr_00 != (float *)0x0) {
        arr_01 = (double *)calloc(__nmemb_00,4);
        if (arr_01 != (double *)0x0) {
          __ptr = (double *)calloc(__nmemb,8);
          if (__ptr == (double *)0x0) {
            free(arr);
            free(arr_00);
          }
          else {
            __base = (double *)calloc(__nmemb,8);
            if (__base == (double *)0x0) {
              free(arr);
              free(arr_00);
              free(arr_01);
              arr_01 = __ptr;
            }
            else {
              __base_00 = (double *)calloc(__nmemb,8);
              if (__base_00 != (double *)0x0) {
                if ((long)__nmemb < 1) {
                  fVar19 = -3.4028235e+38;
                  fVar26 = 3.4028235e+38;
                  lVar9 = 0;
                  local_70 = 0;
                  local_c8 = 0;
                }
                else {
                  fVar26 = 3.4028235e+38;
                  fVar19 = -3.4028235e+38;
                  sVar8 = 0;
                  local_c8 = 0;
                  local_70 = 0;
                  lVar9 = 0;
                  pfVar10 = array;
                  do {
                    sVar3 = 0;
                    sVar4 = sVar3;
                    if (nullcheck != 0) {
                      do {
                        sVar4 = sVar3;
                        if ((pfVar10[sVar3] != nullvalue) || (NAN(pfVar10[sVar3]) || NAN(nullvalue))
                           ) break;
                        sVar3 = sVar3 + 1;
                        sVar4 = __nmemb_00;
                      } while (__nmemb_00 - sVar3 != 0);
                    }
                    if (sVar4 != __nmemb_00) {
                      lVar6 = sVar8 * __nmemb_00;
                      fVar12 = array[lVar6 + sVar4];
                      if (bVar1 || bVar2) {
                        fVar16 = fVar12;
                        if (fVar26 <= fVar12) {
                          fVar16 = fVar26;
                        }
                        fVar26 = fVar16;
                        if (fVar19 < fVar12) {
                          fVar19 = fVar12;
                        }
                      }
                      sVar4 = sVar4 + 1;
                      sVar3 = sVar4;
                      if ((nullcheck != 0) && ((long)sVar4 < (long)__nmemb_00)) {
                        while (sVar3 = sVar4, pfVar10[sVar4] == nullvalue) {
                          if ((NAN(pfVar10[sVar4]) || NAN(nullvalue)) ||
                             (sVar4 = sVar4 + 1, sVar3 = __nmemb_00, __nmemb_00 - sVar4 == 0))
                          break;
                        }
                      }
                      if (sVar3 == __nmemb_00) {
                        lVar9 = lVar9 + 1;
                      }
                      else {
                        fVar16 = array[lVar6 + sVar3];
                        if (bVar1 || bVar2) {
                          fVar17 = fVar16;
                          if (fVar26 <= fVar16) {
                            fVar17 = fVar26;
                          }
                          fVar26 = fVar17;
                          if (fVar19 < fVar16) {
                            fVar19 = fVar16;
                          }
                        }
                        sVar3 = sVar3 + 1;
                        sVar4 = sVar3;
                        if ((nullcheck != 0) && ((long)sVar3 < (long)__nmemb_00)) {
                          while (sVar4 = sVar3, pfVar10[sVar3] == nullvalue) {
                            if ((NAN(pfVar10[sVar3]) || NAN(nullvalue)) ||
                               (sVar3 = sVar3 + 1, sVar4 = __nmemb_00, __nmemb_00 - sVar3 == 0))
                            break;
                          }
                        }
                        if (sVar4 == __nmemb_00) {
                          lVar9 = lVar9 + 2;
                        }
                        else {
                          fVar17 = array[lVar6 + sVar4];
                          if (bVar1 || bVar2) {
                            fVar25 = fVar17;
                            if (fVar26 <= fVar17) {
                              fVar25 = fVar26;
                            }
                            fVar26 = fVar25;
                            if (fVar19 < fVar17) {
                              fVar19 = fVar17;
                            }
                          }
                          sVar4 = sVar4 + 1;
                          sVar3 = sVar4;
                          if ((nullcheck != 0) && ((long)sVar4 < (long)__nmemb_00)) {
                            while (sVar3 = sVar4, pfVar10[sVar4] == nullvalue) {
                              if ((NAN(pfVar10[sVar4]) || NAN(nullvalue)) ||
                                 (sVar4 = sVar4 + 1, sVar3 = __nmemb_00, __nmemb_00 - sVar4 == 0))
                              break;
                            }
                          }
                          if (sVar3 == __nmemb_00) {
                            lVar9 = lVar9 + 3;
                          }
                          else {
                            fVar25 = array[lVar6 + sVar3];
                            if (bVar1 || bVar2) {
                              fVar20 = fVar25;
                              if (fVar26 <= fVar25) {
                                fVar20 = fVar26;
                              }
                              fVar26 = fVar20;
                              if (fVar19 < fVar25) {
                                fVar19 = fVar25;
                              }
                            }
                            sVar3 = sVar3 + 1;
                            sVar4 = sVar3;
                            if ((nullcheck != 0) && ((long)sVar3 < (long)__nmemb_00)) {
                              while (sVar4 = sVar3, pfVar10[sVar3] == nullvalue) {
                                if ((NAN(pfVar10[sVar3]) || NAN(nullvalue)) ||
                                   (sVar3 = sVar3 + 1, sVar4 = __nmemb_00, __nmemb_00 - sVar3 == 0))
                                break;
                              }
                            }
                            if (sVar4 == __nmemb_00) {
                              lVar9 = lVar9 + 4;
                            }
                            else {
                              fVar20 = array[lVar6 + sVar4];
                              if (bVar1 || bVar2) {
                                fVar21 = fVar20;
                                if (fVar26 <= fVar20) {
                                  fVar21 = fVar26;
                                }
                                fVar26 = fVar21;
                                if (fVar19 < fVar20) {
                                  fVar19 = fVar20;
                                }
                              }
                              sVar4 = sVar4 + 1;
                              sVar3 = sVar4;
                              if ((nullcheck != 0) && ((long)sVar4 < (long)__nmemb_00)) {
                                while (sVar3 = sVar4, pfVar10[sVar4] == nullvalue) {
                                  if ((NAN(pfVar10[sVar4]) || NAN(nullvalue)) ||
                                     (sVar4 = sVar4 + 1, sVar3 = __nmemb_00, __nmemb_00 - sVar4 == 0
                                     )) break;
                                }
                              }
                              if (sVar3 == __nmemb_00) {
                                lVar9 = lVar9 + 5;
                              }
                              else {
                                fVar21 = array[lVar6 + sVar3];
                                if (bVar1 || bVar2) {
                                  fVar22 = fVar21;
                                  if (fVar26 <= fVar21) {
                                    fVar22 = fVar26;
                                  }
                                  fVar26 = fVar22;
                                  if (fVar19 < fVar21) {
                                    fVar19 = fVar21;
                                  }
                                }
                                sVar3 = sVar3 + 1;
                                sVar4 = sVar3;
                                if ((nullcheck != 0) && ((long)sVar3 < (long)__nmemb_00)) {
                                  while (sVar4 = sVar3, pfVar10[sVar3] == nullvalue) {
                                    if ((NAN(pfVar10[sVar3]) || NAN(nullvalue)) ||
                                       (sVar3 = sVar3 + 1, sVar4 = __nmemb_00,
                                       __nmemb_00 - sVar3 == 0)) break;
                                  }
                                }
                                if (sVar4 == __nmemb_00) {
                                  lVar9 = lVar9 + 6;
                                }
                                else {
                                  fVar22 = array[lVar6 + sVar4];
                                  if (bVar1 || bVar2) {
                                    fVar23 = fVar22;
                                    if (fVar26 <= fVar22) {
                                      fVar23 = fVar26;
                                    }
                                    fVar26 = fVar23;
                                    if (fVar19 < fVar22) {
                                      fVar19 = fVar22;
                                    }
                                  }
                                  sVar4 = sVar4 + 1;
                                  sVar3 = sVar4;
                                  if ((nullcheck != 0) && ((long)sVar4 < (long)__nmemb_00)) {
                                    while (sVar3 = sVar4, pfVar10[sVar4] == nullvalue) {
                                      if ((NAN(pfVar10[sVar4]) || NAN(nullvalue)) ||
                                         (sVar4 = sVar4 + 1, sVar3 = __nmemb_00,
                                         __nmemb_00 - sVar4 == 0)) break;
                                    }
                                  }
                                  if (sVar3 == __nmemb_00) {
                                    lVar9 = lVar9 + 7;
                                  }
                                  else {
                                    fVar23 = array[lVar6 + sVar3];
                                    if (bVar1 || bVar2) {
                                      fVar24 = fVar23;
                                      if (fVar26 <= fVar23) {
                                        fVar24 = fVar26;
                                      }
                                      fVar26 = fVar24;
                                      if (fVar19 < fVar23) {
                                        fVar19 = fVar23;
                                      }
                                    }
                                    lVar9 = lVar9 + 8;
                                    sVar3 = sVar3 + 1;
                                    if ((long)sVar3 < (long)__nmemb_00) {
                                      lVar11 = 0;
                                      lVar7 = 0;
                                      do {
                                        fVar24 = fVar16;
                                        fVar18 = fVar25;
                                        sVar4 = sVar3;
                                        if ((nullcheck != 0) && ((long)sVar3 < (long)__nmemb_00)) {
                                          while (sVar4 = sVar3, pfVar10[sVar3] == nullvalue) {
                                            if ((NAN(pfVar10[sVar3]) || NAN(nullvalue)) ||
                                               (sVar3 = sVar3 + 1, sVar4 = __nmemb_00,
                                               __nmemb_00 - sVar3 == 0)) break;
                                          }
                                        }
                                        if (sVar4 == __nmemb_00) break;
                                        fVar16 = array[lVar6 + sVar4];
                                        if (bVar1 || bVar2) {
                                          fVar25 = fVar16;
                                          if (fVar26 <= fVar16) {
                                            fVar25 = fVar26;
                                          }
                                          fVar26 = fVar25;
                                          if (fVar19 < fVar16) {
                                            fVar19 = fVar16;
                                          }
                                        }
                                        if (fVar20 == fVar21) {
                                          if ((fVar21 != fVar22) || (NAN(fVar21) || NAN(fVar22)))
                                          goto LAB_001f725e;
                                        }
                                        else {
LAB_001f725e:
                                          arr[lVar7] = ABS(fVar20 - fVar22);
                                          lVar7 = lVar7 + 1;
                                        }
                                        if ((((fVar17 != fVar18) || (fVar18 != fVar20)) ||
                                            (fVar20 != fVar21)) ||
                                           ((fVar21 != fVar22 || (NAN(fVar21) || NAN(fVar22))))) {
                                          arr_00[lVar11] =
                                               ABS(((fVar20 + fVar20) - fVar17) - fVar22);
                                          *(float *)((long)arr_01 + lVar11 * 4) =
                                               ABS(fVar12 + fVar22 * -4.0 +
                                                            fVar20 * 6.0 + fVar17 * -4.0 + fVar16);
                                          lVar11 = lVar11 + 1;
                                        }
                                        else {
                                          lVar9 = lVar9 + 1;
                                        }
                                        sVar3 = sVar4 + 1;
                                        fVar25 = fVar20;
                                        fVar20 = fVar21;
                                        fVar21 = fVar22;
                                        fVar22 = fVar23;
                                        fVar23 = fVar16;
                                        fVar16 = fVar17;
                                        fVar12 = fVar24;
                                        fVar17 = fVar18;
                                      } while ((long)sVar3 < (long)__nmemb_00);
                                    }
                                    else {
                                      lVar7 = 0;
                                      lVar11 = 0;
                                    }
                                    lVar9 = lVar9 + lVar11;
                                    if (lVar11 != 0) {
                                      if (lVar11 == 1) {
                                        if (lVar7 == 1) {
                                          __ptr[local_70] = (double)*arr;
                                          local_70 = local_70 + 1;
                                        }
                                        __base[local_c8] = (double)*arr_00;
                                        fVar12 = *(float *)arr_01;
                                      }
                                      else {
                                        n = (int)lVar11;
                                        if (1 < lVar7) {
                                          fVar12 = quick_select_float(arr,n);
                                          __ptr[local_70] = (double)fVar12;
                                          local_70 = local_70 + 1;
                                        }
                                        fVar12 = quick_select_float(arr_00,n);
                                        __base[local_c8] = (double)fVar12;
                                        fVar12 = quick_select_float((float *)arr_01,n);
                                      }
                                      __base_00[local_c8] = (double)fVar12;
                                      local_c8 = local_c8 + 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    sVar8 = sVar8 + 1;
                    pfVar10 = pfVar10 + lVar5 * nx;
                  } while (sVar8 != __nmemb);
                }
                dVar14 = 0.0;
                dVar15 = 0.0;
                if (local_c8 != 0) {
                  if (local_c8 == 1) {
                    dVar14 = *__base;
                    dVar15 = *__base_00;
                  }
                  else {
                    qsort(__base,local_c8,8,FnCompare_double);
                    qsort(__base_00,local_c8,8,FnCompare_double);
                    lVar5 = ((local_c8 - ((long)(local_c8 - 1) >> 0x3f)) - 1 & 0x3ffffffffffffffe) *
                            4;
                    lVar6 = (local_c8 - ((long)local_c8 >> 0x3f) & 0x3ffffffffffffffe) * 4;
                    dVar14 = (*(double *)((long)__base + lVar5) + *(double *)((long)__base + lVar6))
                             * 0.5;
                    dVar15 = (*(double *)((long)__base_00 + lVar5) +
                             *(double *)((long)__base_00 + lVar6)) * 0.5;
                  }
                }
                dVar13 = 0.0;
                if (local_70 != 0) {
                  if (local_70 == 1) {
                    dVar13 = *__ptr;
                  }
                  else {
                    qsort(__ptr,local_70,8,FnCompare_double);
                    dVar13 = (*(double *)
                               ((long)__ptr +
                               ((local_70 - ((long)(local_70 - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe
                               ) * 4) +
                             *(double *)
                              ((long)__ptr +
                              (local_70 - ((long)local_70 >> 0x3f) & 0xfffffffffffffffe) * 4)) * 0.5
                    ;
                  }
                }
                if (ngood != (long *)0x0) {
                  *ngood = lVar9;
                }
                if (minval != (float *)0x0) {
                  *minval = fVar26;
                }
                if (maxval != (float *)0x0) {
                  *maxval = fVar19;
                }
                if (noise2 != (double *)0x0) {
                  *noise2 = dVar13 * 1.0483579;
                }
                if (noise3 != (double *)0x0) {
                  *noise3 = dVar14 * 0.6052697;
                }
                if (noise5 != (double *)0x0) {
                  *noise5 = dVar15 * 0.1772048;
                }
                free(__base_00);
                free(__base);
                free(__ptr);
                free(arr_01);
                free(arr_00);
                free(arr);
                return extraout_EAX;
              }
              free(arr);
              free(arr_00);
              free(arr_01);
              free(__ptr);
              arr_01 = __base;
            }
          }
          free(arr_01);
          *status = 0x71;
          arr = (float *)status;
          goto LAB_001f7509;
        }
        free(arr);
        arr = arr_00;
      }
      free(arr);
      arr = extraout_RAX;
    }
    *status = 0x71;
  }
LAB_001f7509:
  return (int)arr;
}

Assistant:

static int FnNoise5_float
       (float *array,       /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
        long ny,            /* number of rows in the image */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */
   /* returned parameters */   
	long *ngood,        /* number of good, non-null pixels? */
	float *minval,    /* minimum non-null value */
	float *maxval,    /* maximum non-null value */
	double *noise2,      /* returned 2nd order MAD of all non-null pixels */
	double *noise3,      /* returned 3rd order MAD of all non-null pixels */
	double *noise5,      /* returned 5th order MAD of all non-null pixels */
	int *status)        /* error status */

/*
Estimate the median and background noise in the input image using 2nd, 3rd and 5th
order Median Absolute Differences.

The noise in the background of the image is calculated using the MAD algorithms 
developed for deriving the signal to noise ratio in spectra
(see issue #42 of the ST-ECF newsletter, http://www.stecf.org/documents/newsletter/)

3rd order:  noise = 1.482602 / sqrt(6) * median (abs(2*flux(i) - flux(i-2) - flux(i+2)))

The returned estimates are the median of the values that are computed for each 
row of the image.
*/
{
	long ii, jj, nrows = 0, nrows2 = 0, nvals, nvals2, ngoodpix = 0;
	float *differences2, *differences3, *differences5;
	float *rowpix, v1, v2, v3, v4, v5, v6, v7, v8, v9;
	float xminval = FLT_MAX, xmaxval = -FLT_MAX;
	int do_range = 0;
	double *diffs2, *diffs3, *diffs5; 
	double xnoise2 = 0, xnoise3 = 0, xnoise5 = 0;
	
	if (nx < 9) {
		/* treat entire array as an image with a single row */
		nx = nx * ny;
		ny = 1;
	}

	/* rows must have at least 9 pixels */
	if (nx < 9) {

		for (ii = 0; ii < nx; ii++) {
		    if (nullcheck && array[ii] == nullvalue)
		        continue;
		    else {
			if (array[ii] < xminval) xminval = array[ii];
			if (array[ii] > xmaxval) xmaxval = array[ii];
			ngoodpix++;
		    }
		}
		if (minval) *minval = xminval;
		if (maxval) *maxval = xmaxval;
		if (ngood) *ngood = ngoodpix;
		if (noise2) *noise2 = 0.;
		if (noise3) *noise3 = 0.;
		if (noise5) *noise5 = 0.;
		return(*status);
	}

	/* do we need to compute the min and max value? */
	if (minval || maxval) do_range = 1;
	
        /* allocate arrays used to compute the median and noise estimates */
	differences2 = calloc(nx, sizeof(float));
	if (!differences2) {
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}
	differences3 = calloc(nx, sizeof(float));
	if (!differences3) {
		free(differences2);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}
	differences5 = calloc(nx, sizeof(float));
	if (!differences5) {
		free(differences2);
		free(differences3);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs2 = calloc(ny, sizeof(double));
	if (!diffs2) {
		free(differences2);
		free(differences3);
		free(differences5);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs3 = calloc(ny, sizeof(double));
	if (!diffs3) {
		free(differences2);
		free(differences3);
		free(differences5);
		free(diffs2);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs5 = calloc(ny, sizeof(double));
	if (!diffs5) {
		free(differences2);
		free(differences3);
		free(differences5);
		free(diffs2);
		free(diffs3);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* loop over each row of the image */
	for (jj=0; jj < ny; jj++) {

                rowpix = array + (jj * nx); /* point to first pixel in the row */

		/***** find the first valid pixel in row */
		ii = 0;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v1 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v1 < xminval) xminval = v1;
			if (v1 > xmaxval) xmaxval = v1;
		}

		/***** find the 2nd valid pixel in row (which we will skip over) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v2 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;
		
		if (do_range) {
			if (v2 < xminval) xminval = v2;
			if (v2 > xmaxval) xmaxval = v2;
		}

		/***** find the 3rd valid pixel in row */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v3 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v3 < xminval) xminval = v3;
			if (v3 > xmaxval) xmaxval = v3;
		}
				
		/* find the 4nd valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v4 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v4 < xminval) xminval = v4;
			if (v4 > xmaxval) xmaxval = v4;
		}
			
		/* find the 5th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v5 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v5 < xminval) xminval = v5;
			if (v5 > xmaxval) xmaxval = v5;
		}
				
		/* find the 6th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v6 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v6 < xminval) xminval = v6;
			if (v6 > xmaxval) xmaxval = v6;
		}
				
		/* find the 7th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v7 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v7 < xminval) xminval = v7;
			if (v7 > xmaxval) xmaxval = v7;
		}
				
		/* find the 8th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v8 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v8 < xminval) xminval = v8;
			if (v8 > xmaxval) xmaxval = v8;
		}
		/* now populate the differences arrays */
		/* for the remaining pixels in the row */
		nvals = 0;
		nvals2 = 0;
		for (ii++; ii < nx; ii++) {

		    /* find the next valid pixel in row */
                    if (nullcheck)
		        while (ii < nx && rowpix[ii] == nullvalue) ii++;
		     
		    if (ii == nx) break;  /* hit end of row */
		    v9 = rowpix[ii];  /* store the good pixel value */

		    if (do_range) {
			if (v9 < xminval) xminval = v9;
			if (v9 > xmaxval) xmaxval = v9;
		    }

		    /* construct array of absolute differences */

		    if (!(v5 == v6 && v6 == v7) ) {
		        differences2[nvals2] = (float) fabs(v5 - v7);
			nvals2++;
		    }

		    if (!(v3 == v4 && v4 == v5 && v5 == v6 && v6 == v7) ) {
		        differences3[nvals] = (float) fabs((2 * v5) - v3 - v7);
		        differences5[nvals] = (float) fabs((6 * v5) - (4 * v3) - (4 * v7) + v1 + v9);
		        nvals++;  
		    } else {
		        /* ignore constant background regions */
			ngoodpix++;
		    }

		    /* shift over 1 pixel */
		    v1 = v2;
		    v2 = v3;
		    v3 = v4;
		    v4 = v5;
		    v5 = v6;
		    v6 = v7;
		    v7 = v8;
		    v8 = v9;
	        }  /* end of loop over pixels in the row */

		/* compute the median diffs */
		/* Note that there are 8 more pixel values than there are diffs values. */
		ngoodpix += nvals;

		if (nvals == 0) {
		    continue;  /* cannot compute medians on this row */
		} else if (nvals == 1) {
		    if (nvals2 == 1) {
		        diffs2[nrows2] = differences2[0];
			nrows2++;
		    }
		        
		    diffs3[nrows] = differences3[0];
		    diffs5[nrows] = differences5[0];
		} else {
                    /* quick_select returns the median MUCH faster than using qsort */
		    if (nvals2 > 1) {
                        diffs2[nrows2] = quick_select_float(differences2, nvals);
			nrows2++;
		    }

                    diffs3[nrows] = quick_select_float(differences3, nvals);
                    diffs5[nrows] = quick_select_float(differences5, nvals);
		}

		nrows++;
	}  /* end of loop over rows */

	    /* compute median of the values for each row */
	if (nrows == 0) { 
	       xnoise3 = 0;
	       xnoise5 = 0;
	} else if (nrows == 1) {
	       xnoise3 = diffs3[0];
	       xnoise5 = diffs5[0];
	} else {	    
	       qsort(diffs3, nrows, sizeof(double), FnCompare_double);
	       qsort(diffs5, nrows, sizeof(double), FnCompare_double);
	       xnoise3 =  (diffs3[(nrows - 1)/2] + diffs3[nrows/2]) / 2.;
	       xnoise5 =  (diffs5[(nrows - 1)/2] + diffs5[nrows/2]) / 2.;
	}

	if (nrows2 == 0) { 
	       xnoise2 = 0;
	} else if (nrows2 == 1) {
	       xnoise2 = diffs2[0];
	} else {	    
	       qsort(diffs2, nrows2, sizeof(double), FnCompare_double);
	       xnoise2 =  (diffs2[(nrows2 - 1)/2] + diffs2[nrows2/2]) / 2.;
	}

	if (ngood)  *ngood  = ngoodpix;
	if (minval) *minval = xminval;
	if (maxval) *maxval = xmaxval;
	if (noise2)  *noise2  = 1.0483579 * xnoise2;
	if (noise3)  *noise3  = 0.6052697 * xnoise3;
	if (noise5)  *noise5  = 0.1772048 * xnoise5;

	free(diffs5);
	free(diffs3);
	free(diffs2);
	free(differences5);
	free(differences3);
	free(differences2);

	return(*status);
}